

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O1

void __thiscall
RhombicCode::sweepFullVertex
          (RhombicCode *this,int vertexIndex,vstr *sweepEdges,string *sweepDirection,
          vstr *upEdgeDirections)

{
  uniform_int_distribution<int> *puVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t __n;
  result_type_conflict rVar9;
  int iVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  ulong uVar12;
  invalid_argument *this_00;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  vint vertices;
  allocator_type local_1e9;
  size_t local_1e8;
  RhombicCode *local_1e0;
  int local_1d4;
  vint local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  long *local_170 [2];
  long local_160 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar2 = (upEdgeDirections->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (sweepEdges->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = this;
  local_1d4 = vertexIndex;
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (pbVar3,(sweepEdges->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,sweepDirection);
  pbVar4 = (sweepEdges->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(sweepEdges->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
  if (uVar13 == 0x80) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar5 = (sweepDirection->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
    local_190[0] = local_180;
    pcVar5 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar5,pcVar5 + pbVar2->_M_string_length);
    plVar14 = local_160;
    pcVar5 = (pbVar2->_M_dataplus)._M_p;
    local_170[0] = plVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,pcVar5,pcVar5 + pbVar2->_M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__l,&local_1e9);
    Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar15 = -0x60;
    do {
      if (plVar14 != (long *)plVar14[-2]) {
        operator_delete((long *)plVar14[-2],*plVar14 + 1);
      }
      plVar14 = plVar14 + -4;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0);
    Code::localFlip(&local_1e0->super_Code,&local_1d0);
    if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar5 = (sweepDirection->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
    local_190[0] = local_180;
    pcVar5 = pbVar2[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
    plVar14 = local_160;
    pcVar5 = pbVar2[1]._M_dataplus._M_p;
    local_170[0] = plVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
    __l_00._M_len = 3;
    __l_00._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,__l_00,&local_1e9);
    Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    lVar15 = -0x60;
    do {
      if (plVar14 != (long *)plVar14[-2]) {
        operator_delete((long *)plVar14[-2],*plVar14 + 1);
      }
      plVar14 = plVar14 + -4;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0);
    Code::localFlip(&local_1e0->super_Code,&local_1d0);
    if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar5 = (sweepDirection->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
    local_190[0] = local_180;
    pcVar5 = pbVar2[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
    plVar14 = local_160;
    pcVar5 = pbVar2[2]._M_dataplus._M_p;
    local_170[0] = plVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
    __l_01._M_len = 3;
    __l_01._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,__l_01,&local_1e9);
    Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    lVar15 = -0x60;
    do {
      if (plVar14 != (long *)plVar14[-2]) {
        operator_delete((long *)plVar14[-2],*plVar14 + 1);
      }
      plVar14 = plVar14 + -4;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0);
    Code::localFlip(&local_1e0->super_Code,&local_1d0);
    goto LAB_001149d2;
  }
  uVar12 = (long)_Var11._M_current - (long)pbVar3;
  if (uVar12 < uVar13) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(sweepEdges,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pbVar4 + uVar12));
    if ((long)(sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x40) {
      puVar1 = &(local_1e0->super_Code).distInt0To1;
      rVar9 = std::uniform_int_distribution<int>::operator()
                        (puVar1,&(local_1e0->super_Code).rnEngine,&puVar1->_M_param);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(sweepEdges,
                 (sweepEdges->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + rVar9);
    }
    pbVar3 = (sweepEdges->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar6 = pbVar3->_M_string_length;
    if (sVar6 == pbVar2->_M_string_length) {
      if (sVar6 != 0) {
        iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,(pbVar2->_M_dataplus)._M_p,sVar6);
        if (iVar10 != 0) goto LAB_00113f22;
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = (pbVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2->_M_string_length);
      plVar14 = local_160;
      pcVar5 = (pbVar2->_M_dataplus)._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2->_M_string_length);
      __l_05._M_len = 3;
      __l_05._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_90,__l_05,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
      goto LAB_001149d2;
    }
LAB_00113f22:
    if (sVar6 == pbVar2[2]._M_string_length) {
      if (sVar6 != 0) {
        iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[2]._M_dataplus._M_p,sVar6);
        if (iVar10 != 0) goto LAB_00113f48;
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      plVar14 = local_160;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      __l_06._M_len = 3;
      __l_06._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a8,__l_06,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
      goto LAB_001149d2;
    }
LAB_00113f48:
    if (sVar6 != pbVar2[1]._M_string_length) {
LAB_00114a19:
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
      goto LAB_00114a35;
    }
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[1]._M_dataplus._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00114a19;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    pcVar5 = (sweepDirection->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
    local_190[0] = local_180;
    pcVar5 = pbVar2[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
    plVar14 = local_160;
    pcVar5 = pbVar2[1]._M_dataplus._M_p;
    local_170[0] = plVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
    __l_02._M_len = 3;
    __l_02._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,__l_02,&local_1e9);
    Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    lVar15 = -0x60;
    do {
      if (plVar14 != (long *)plVar14[-2]) {
        operator_delete((long *)plVar14[-2],*plVar14 + 1);
      }
      plVar14 = plVar14 + -4;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0);
    Code::localFlip(&local_1e0->super_Code,&local_1d0);
    goto LAB_001149d2;
  }
  if (uVar13 == 0x60) {
    puVar1 = &(local_1e0->super_Code).distInt0To2;
    rVar9 = std::uniform_int_distribution<int>::operator()
                      (puVar1,&(local_1e0->super_Code).rnEngine,&puVar1->_M_param);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(sweepEdges,
               (sweepEdges->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + rVar9);
  }
  pbVar3 = (sweepEdges->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar6 = pbVar3->_M_string_length;
  sVar7 = pbVar2->_M_string_length;
  if (sVar6 == sVar7) {
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,(pbVar2->_M_dataplus)._M_p,sVar6);
      if (iVar10 != 0) goto LAB_001140e0;
    }
    sVar8 = pbVar3[1]._M_string_length;
    if (sVar8 != pbVar2[2]._M_string_length) goto LAB_001140e0;
    if (sVar8 != 0) {
      iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,pbVar2[2]._M_dataplus._M_p,sVar8);
      if (iVar10 != 0) goto LAB_001140e0;
    }
    goto LAB_00114612;
  }
LAB_001140e0:
  local_1e8 = pbVar2[2]._M_string_length;
  if (sVar6 == local_1e8) {
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[2]._M_dataplus._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00114130;
    }
    sVar8 = pbVar3[1]._M_string_length;
    if (sVar8 == sVar7) {
      if (sVar8 != 0) {
        iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,(pbVar2->_M_dataplus)._M_p,sVar8);
        if (iVar10 != 0) goto LAB_00114130;
      }
LAB_00114612:
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = (pbVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2->_M_string_length);
      plVar14 = local_160;
      pcVar5 = (pbVar2->_M_dataplus)._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2->_M_string_length);
      __l_07._M_len = 3;
      __l_07._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8,__l_07,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      plVar14 = local_160;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      __l_08._M_len = 3;
      __l_08._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_f0,__l_08,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
      goto LAB_001149d2;
    }
  }
LAB_00114130:
  if (sVar6 == sVar7) {
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,(pbVar2->_M_dataplus)._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00114178;
    }
    sVar8 = pbVar3[1]._M_string_length;
    if (sVar8 != pbVar2[1]._M_string_length) goto LAB_00114178;
    if (sVar8 != 0) {
      iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,pbVar2[1]._M_dataplus._M_p,sVar8);
      if (iVar10 != 0) goto LAB_00114178;
    }
    goto LAB_001147f4;
  }
LAB_00114178:
  sVar8 = pbVar2[1]._M_string_length;
  if (sVar6 == sVar8) {
    if (sVar6 == 0) {
LAB_0011419e:
      __n = pbVar3[1]._M_string_length;
      if (__n == sVar7) {
        if (__n != 0) {
          iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,(pbVar2->_M_dataplus)._M_p,__n);
          if (iVar10 != 0) goto LAB_001141c7;
        }
LAB_001147f4:
        pcVar5 = (sweepDirection->_M_dataplus)._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
        local_190[0] = local_180;
        pcVar5 = (pbVar2->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,pcVar5,pcVar5 + pbVar2->_M_string_length);
        plVar14 = local_160;
        pcVar5 = (pbVar2->_M_dataplus)._M_p;
        local_170[0] = plVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,pcVar5,pcVar5 + pbVar2->_M_string_length);
        __l_09._M_len = 3;
        __l_09._M_array = &local_1b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_108,__l_09,&local_1e9);
        Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        lVar15 = -0x60;
        do {
          if (plVar14 != (long *)plVar14[-2]) {
            operator_delete((long *)plVar14[-2],*plVar14 + 1);
          }
          plVar14 = plVar14 + -4;
          lVar15 = lVar15 + 0x20;
        } while (lVar15 != 0);
        Code::localFlip(&local_1e0->super_Code,&local_1d0);
        if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pcVar5 = (sweepDirection->_M_dataplus)._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
        local_190[0] = local_180;
        pcVar5 = pbVar2[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
        plVar14 = local_160;
        pcVar5 = pbVar2[1]._M_dataplus._M_p;
        local_170[0] = plVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
        __l_10._M_len = 3;
        __l_10._M_array = &local_1b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_120,__l_10,&local_1e9);
        Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_120);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_120);
        lVar15 = -0x60;
        do {
          if (plVar14 != (long *)plVar14[-2]) {
            operator_delete((long *)plVar14[-2],*plVar14 + 1);
          }
          plVar14 = plVar14 + -4;
          lVar15 = lVar15 + 0x20;
        } while (lVar15 != 0);
        Code::localFlip(&local_1e0->super_Code,&local_1d0);
        goto LAB_001149d2;
      }
    }
    else {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[1]._M_dataplus._M_p,sVar6);
      if (iVar10 == 0) goto LAB_0011419e;
    }
LAB_001141c7:
    if (sVar6 != sVar8) goto LAB_00114208;
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[1]._M_dataplus._M_p,sVar6);
      if (iVar10 != 0) goto LAB_00114208;
    }
    sVar7 = pbVar3[1]._M_string_length;
    if (sVar7 != local_1e8) goto LAB_00114208;
    if (sVar7 != 0) {
      iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,pbVar2[2]._M_dataplus._M_p,sVar7);
      if (iVar10 != 0) goto LAB_00114208;
    }
    goto LAB_00114259;
  }
LAB_00114208:
  if (sVar6 == local_1e8) {
    if (sVar6 != 0) {
      iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,pbVar2[2]._M_dataplus._M_p,sVar6);
      if (iVar10 != 0) goto LAB_001149fb;
    }
    sVar6 = pbVar3[1]._M_string_length;
    if (sVar6 == sVar8) {
      if (sVar6 != 0) {
        iVar10 = bcmp(pbVar3[1]._M_dataplus._M_p,pbVar2[1]._M_dataplus._M_p,sVar6);
        if (iVar10 != 0) goto LAB_001149fb;
      }
LAB_00114259:
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = pbVar2[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
      plVar14 = local_160;
      pcVar5 = pbVar2[1]._M_dataplus._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2[1]._M_string_length);
      __l_03._M_len = 3;
      __l_03._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,__l_03,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pcVar5 = (sweepDirection->_M_dataplus)._M_p;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar5,pcVar5 + sweepDirection->_M_string_length);
      local_190[0] = local_180;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      plVar14 = local_160;
      pcVar5 = pbVar2[2]._M_dataplus._M_p;
      local_170[0] = plVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar5,pcVar5 + pbVar2[2]._M_string_length);
      __l_04._M_len = 3;
      __l_04._M_array = &local_1b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_150,__l_04,&local_1e9);
      Code::faceVertices(&local_1d0,&local_1e0->super_Code,local_1d4,&local_150);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_150);
      lVar15 = -0x60;
      do {
        if (plVar14 != (long *)plVar14[-2]) {
          operator_delete((long *)plVar14[-2],*plVar14 + 1);
        }
        plVar14 = plVar14 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      Code::localFlip(&local_1e0->super_Code,&local_1d0);
LAB_001149d2:
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_001149fb:
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
LAB_00114a35:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RhombicCode::sweepFullVertex(const int vertexIndex, vstr &sweepEdges, const std::string &sweepDirection, const vstr &upEdgeDirections)
{
    // std::cout << "Sweep of coordinate = " << lattice->indexToCoordinate(vertexIndex) << " ... ";
    auto &edge0 = upEdgeDirections[0];
    auto &edge1 = upEdgeDirections[1];
    auto &edge2 = upEdgeDirections[2];
    // cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
    auto sweepDirectionIndex = std::distance(sweepEdges.begin(), std::find(sweepEdges.begin(), sweepEdges.end(), sweepDirection));
    if (sweepEdges.size() == 4)
    {
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
    }
    else if (sweepDirectionIndex < sweepEdges.size())
    {
        sweepEdges.erase(sweepEdges.begin() + sweepDirectionIndex);
        if (sweepEdges.size() == 2)
        {
            // int delIndex = distInt0To1(mt);
            int delIndex = distInt0To1(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if (sweepEdges[0] == edge0)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge2)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge1)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    else
    {
        if (sweepEdges.size() == 3)
        {
            // int delIndex = distInt0To2(mt);
            int delIndex = distInt0To2(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge2) ||
            (sweepEdges[0] == edge2 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge1) ||
                 (sweepEdges[0] == edge1 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge1 && sweepEdges[1] == edge2) ||
                 (sweepEdges[0] == edge2 && sweepEdges[1] == edge1))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    // std::cout << "Successful." << std::endl;
}